

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  ulong uVar1;
  IResultCapture *pIVar2;
  NonCopyable *in_RDI;
  SectionEndInfo endInfo;
  double in_stack_ffffffffffffff38;
  SectionInfo *in_stack_ffffffffffffff40;
  SectionInfo *in_stack_ffffffffffffff48;
  SectionEndInfo *this_00;
  undefined1 local_90 [144];
  
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__Section_002377c8;
  if (((ulong)in_RDI[0x15]._vptr_NonCopyable & 1) != 0) {
    this_00 = (SectionEndInfo *)(in_RDI + 1);
    Timer::getElapsedSeconds((Timer *)0x19d012);
    SectionEndInfo::SectionEndInfo
              (this_00,in_stack_ffffffffffffff48,(Counts *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    uVar1 = std::uncaught_exception();
    if ((uVar1 & 1) == 0) {
      in_stack_ffffffffffffff40 = (SectionInfo *)getResultCapture();
      (*(*(_func_int ***)in_stack_ffffffffffffff40)[4])(in_stack_ffffffffffffff40,local_90);
    }
    else {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[5])(pIVar2,local_90);
    }
    SectionEndInfo::~SectionEndInfo((SectionEndInfo *)0x19d091);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0xe));
  SectionInfo::~SectionInfo(in_stack_ffffffffffffff40);
  NonCopyable::~NonCopyable(in_RDI);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }